

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O3

void duckdb::UnaryExecutor::
     ExecuteLoop<duckdb::timestamp_t,long,duckdb::GenericUnaryWrapper,duckdb::DatePart::PartOperator<duckdb::DatePart::HoursOperator>>
               (timestamp_t *ldata,long *result_data,idx_t count,SelectionVector *sel_vector,
               ValidityMask *mask,ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  sel_t *psVar1;
  timestamp_t tVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  byte bVar4;
  element_type *peVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  bool bVar7;
  ulong uVar8;
  dtime_t dVar9;
  TemplatedValidityData<unsigned_long> *pTVar10;
  _Head_base<0UL,_unsigned_long_*,_false> _Var11;
  long lVar12;
  idx_t idx_in_entry;
  ulong uVar13;
  element_type *local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_60;
  idx_t local_50;
  buffer_ptr<ValidityBuffer> *local_48;
  timestamp_t *local_40;
  long *local_38;
  
  local_40 = ldata;
  local_38 = result_data;
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      psVar1 = sel_vector->sel_vector;
      local_48 = &(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data;
      uVar13 = 0;
      do {
        uVar8 = uVar13;
        if (psVar1 != (sel_t *)0x0) {
          uVar8 = (ulong)psVar1[uVar13];
        }
        tVar2.value = local_40[uVar8].value;
        bVar7 = Value::IsFinite<duckdb::timestamp_t>(tVar2);
        if (bVar7) {
          dVar9 = Timestamp::GetTime(tVar2);
          lVar12 = dVar9.micros / 3600000000;
        }
        else {
          _Var11._M_head_impl =
               (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
          if (_Var11._M_head_impl == (unsigned_long *)0x0) {
            local_50 = (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)&local_68,&local_50);
            p_Var6 = p_Stack_60;
            peVar5 = local_68;
            local_68 = (element_type *)0x0;
            p_Stack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            p_Var3 = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.
                     internal.
                     super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
            (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = peVar5;
            (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = p_Var6;
            if ((p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
               (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3),
               p_Stack_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_60);
            }
            pTVar10 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                (local_48);
            _Var11._M_head_impl =
                 (pTVar10->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
            (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
                 _Var11._M_head_impl;
          }
          bVar4 = (byte)uVar13 & 0x3f;
          _Var11._M_head_impl[uVar13 >> 6] =
               _Var11._M_head_impl[uVar13 >> 6] &
               (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4);
          lVar12 = 0;
        }
        local_38[uVar13] = lVar12;
        uVar13 = uVar13 + 1;
      } while (count != uVar13);
    }
  }
  else if (count != 0) {
    psVar1 = sel_vector->sel_vector;
    local_48 = &(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data;
    uVar13 = 0;
    do {
      uVar8 = uVar13;
      if (psVar1 != (sel_t *)0x0) {
        uVar8 = (ulong)psVar1[uVar13];
      }
      if (((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask[uVar8 >> 6] >>
           (uVar8 & 0x3f) & 1) == 0) {
        _Var11._M_head_impl =
             (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if (_Var11._M_head_impl == (unsigned_long *)0x0) {
          local_50 = (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_68,&local_50);
          p_Var6 = p_Stack_60;
          peVar5 = local_68;
          local_68 = (element_type *)0x0;
          p_Stack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          p_Var3 = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
          (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = peVar5;
          (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = p_Var6;
          if ((p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3),
             p_Stack_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_60);
          }
          pTVar10 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (local_48);
          _Var11._M_head_impl =
               (pTVar10->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
               _Var11._M_head_impl;
        }
        bVar4 = (byte)uVar13 & 0x3f;
        _Var11._M_head_impl[uVar13 >> 6] =
             _Var11._M_head_impl[uVar13 >> 6] & (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4)
        ;
      }
      else {
        tVar2.value = local_40[uVar8].value;
        bVar7 = Value::IsFinite<duckdb::timestamp_t>(tVar2);
        if (bVar7) {
          dVar9 = Timestamp::GetTime(tVar2);
          lVar12 = dVar9.micros / 3600000000;
        }
        else {
          _Var11._M_head_impl =
               (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
          if (_Var11._M_head_impl == (unsigned_long *)0x0) {
            local_50 = (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)&local_68,&local_50);
            p_Var6 = p_Stack_60;
            peVar5 = local_68;
            local_68 = (element_type *)0x0;
            p_Stack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            p_Var3 = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.
                     internal.
                     super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
            (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = peVar5;
            (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = p_Var6;
            if ((p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
               (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3),
               p_Stack_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_60);
            }
            pTVar10 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                (local_48);
            _Var11._M_head_impl =
                 (pTVar10->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
            (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
                 _Var11._M_head_impl;
          }
          bVar4 = (byte)uVar13 & 0x3f;
          _Var11._M_head_impl[uVar13 >> 6] =
               _Var11._M_head_impl[uVar13 >> 6] &
               (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4);
          lVar12 = 0;
        }
        local_38[uVar13] = lVar12;
      }
      uVar13 = uVar13 + 1;
    } while (count != uVar13);
  }
  return;
}

Assistant:

static inline void ExecuteLoop(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               const SelectionVector *__restrict sel_vector, ValidityMask &mask,
	                               ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
#ifdef DEBUG
		// ldata may point to a compressed dictionary buffer which can be smaller than ldata + count
		idx_t max_index = 0;
		for (idx_t i = 0; i < count; i++) {
			auto idx = sel_vector->get_index(i);
			max_index = MaxValue(max_index, idx);
		}
		ASSERT_RESTRICT(ldata, ldata + max_index, result_data, result_data + count);
#endif

		if (!mask.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto idx = sel_vector->get_index(i);
				if (mask.RowIsValidUnsafe(idx)) {
					result_data[i] =
					    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[idx], result_mask, i, dataptr);
				} else {
					result_mask.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto idx = sel_vector->get_index(i);
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[idx], result_mask, i, dataptr);
			}
		}
	}